

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

UpnpListIter UpnpListInsert(UpnpListHead *list,UpnpListIter pos,UpnpListHead *elt)

{
  elt->prev = pos->prev;
  elt->next = pos;
  pos->prev->next = elt;
  pos->prev = elt;
  return elt;
}

Assistant:

UpnpListIter UpnpListInsert(
	UpnpListHead *list, UpnpListIter pos, UpnpListHead *elt)
{
	(void)list;
	elt->prev = pos->prev;
	elt->next = pos;
	pos->prev->next = elt;
	pos->prev = elt;
	return elt;
}